

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

int loader_initialize(void)

{
  int iVar1;
  loader_manager_impl manager_impl;
  plugin_manager_interface ppVar2;
  
  iVar1 = 0;
  if (loader_manager_initialized == '\0') {
    manager_impl = loader_manager_impl_initialize();
    if (manager_impl == (loader_manager_impl)0x0) {
      log_write_impl_va("metacall",0x66,"loader_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,"Loader manager failed to initialize");
    }
    else {
      ppVar2 = loader_manager_impl_iface();
      iVar1 = plugin_manager_initialize
                        (&loader_manager,"loader","LOADER_LIBRARY_PATH","/usr/local/lib",ppVar2,
                         manager_impl);
      if (iVar1 == 0) {
        iVar1 = plugin_manager_register(&loader_manager,manager_impl->host);
        if (iVar1 == 0) {
          loader_initialization_register_plugin(manager_impl->host);
          loader_manager_initialized = 1;
          return 0;
        }
        log_write_impl_va("metacall",0x80,"loader_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,3,"Loader host failed to initialize");
        plugin_destroy(manager_impl->host);
        plugin_manager_destroy(&loader_manager);
      }
      else {
        log_write_impl_va("metacall",0x78,"loader_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,3,"Loader plugin manager failed to initialize");
        loader_manager_impl_destroy(manager_impl);
      }
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int loader_initialize(void)
{
	if (loader_manager_initialized == 0)
	{
		return 0;
	}

	loader_manager_impl manager_impl = loader_manager_impl_initialize();

	if (manager_impl == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader manager failed to initialize");
		return 1;
	}

	int result = plugin_manager_initialize(
		&loader_manager,
		LOADER_MANAGER_NAME,
		LOADER_LIBRARY_PATH,
#if defined(LOADER_LIBRARY_INSTALL_PATH)
		LOADER_LIBRARY_INSTALL_PATH,
#else
		LOADER_LIBRARY_DEFAULT_PATH,
#endif /* LOADER_LIBRARY_INSTALL_PATH */
		loader_manager_impl_iface(),
		manager_impl);

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader plugin manager failed to initialize");
		loader_manager_impl_destroy(manager_impl);
		return 1;
	}

	/* Register host loader */
	if (plugin_manager_register(&loader_manager, manager_impl->host) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader host failed to initialize");
		plugin_destroy(manager_impl->host);
		plugin_manager_destroy(&loader_manager);
		return 1;
	}

	/* Insert into destruction list */
	loader_initialization_register_plugin(manager_impl->host);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader host initialized"); */

	loader_manager_initialized = 0;

	return 0;
}